

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofRZ.cpp
# Opt level: O2

void __thiscall OpenMD::GofRZ::writeRdf(GofRZ *this)

{
  long lVar1;
  char cVar2;
  ostream *poVar3;
  pointer pvVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ofstream rdfStream;
  
  std::ofstream::ofstream
            (&rdfStream,
             (this->super_RadialDistrFunc).super_StaticAnalyser.outputFilename_._M_dataplus._M_p,
             _S_out);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    snprintf(painCave.errMsg,2000,"GofRZ: unable to open %s\n",
             (this->super_RadialDistrFunc).super_StaticAnalyser.outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::operator<<((ostream *)&rdfStream,"#radial distribution function\n");
    poVar3 = std::operator<<((ostream *)&rdfStream,"#selection1: (");
    poVar3 = std::operator<<(poVar3,(string *)&(this->super_RadialDistrFunc).selectionScript1_);
    std::operator<<(poVar3,")\t");
    poVar3 = std::operator<<((ostream *)&rdfStream,"selection2: (");
    poVar3 = std::operator<<(poVar3,(string *)&(this->super_RadialDistrFunc).selectionScript2_);
    std::operator<<(poVar3,")\n");
    poVar3 = std::operator<<((ostream *)&rdfStream,"#nBins = ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,"\t maxLen = ");
    poVar3 = std::ostream::_M_insert<double>(this->len_);
    std::operator<<(poVar3,"deltaR = ");
    poVar3 = std::ostream::_M_insert<double>(this->deltaR_);
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<((ostream *)&rdfStream,"#n");
    poVar3 = std::operator<<(poVar3,(string *)&this->axisLabel_);
    poVar3 = std::operator<<(poVar3,"Bins =");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,this->nZBins_);
    poVar3 = std::operator<<(poVar3,"\t delta");
    poVar3 = std::operator<<(poVar3,(string *)&this->axisLabel_);
    std::operator<<(poVar3," = ");
    poVar3 = std::ostream::_M_insert<double>(this->deltaZ_);
    std::operator<<(poVar3,"\n");
    uVar6 = 0;
    while( true ) {
      uVar7 = (ulong)uVar6;
      pvVar4 = (this->avgGofr_).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->avgGofr_).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4) / 0x18) <= uVar7
         ) break;
      uVar5 = 0;
      while( true ) {
        lVar1 = *(long *)&pvVar4[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data;
        if ((ulong)((long)*(pointer *)
                           ((long)&pvVar4[uVar7].super__Vector_base<double,_std::allocator<double>_>
                                   ._M_impl.super__Vector_impl_data + 8) - lVar1 >> 3) <=
            (ulong)uVar5) break;
        poVar3 = std::ostream::_M_insert<double>
                           (*(double *)(lVar1 + (ulong)uVar5 * 8) /
                            (double)(this->super_RadialDistrFunc).nProcessed_);
        std::operator<<(poVar3,"\t");
        uVar5 = uVar5 + 1;
        pvVar4 = (this->avgGofr_).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      std::operator<<((ostream *)&rdfStream,"\n");
      uVar6 = uVar6 + 1;
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&rdfStream);
  return;
}

Assistant:

void GofRZ::writeRdf() {
    std::ofstream rdfStream(outputFilename_.c_str());
    if (rdfStream.is_open()) {
      rdfStream << "#radial distribution function\n";
      rdfStream << "#selection1: (" << selectionScript1_ << ")\t";
      rdfStream << "selection2: (" << selectionScript2_ << ")\n";
      rdfStream << "#nBins = " << nBins_ << "\t maxLen = " << len_
                << "deltaR = " << deltaR_ << "\n";
      rdfStream << "#n" << axisLabel_ << "Bins =" << nZBins_ << "\t delta"
                << axisLabel_ << " = " << deltaZ_ << "\n";
      for (unsigned int i = 0; i < avgGofr_.size(); ++i) {
        // RealType r = deltaR_ * (i + 0.5);

        for (unsigned int j = 0; j < avgGofr_[i].size(); ++j) {
          // RealType z = deltaZ_ * (j + 0.5);
          rdfStream << avgGofr_[i][j] / nProcessed_ << "\t";
        }

        rdfStream << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "GofRZ: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    rdfStream.close();
  }